

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

SyHashEntry_Pr * HashGetEntry(SyHash *pHash,void *pKey,sxu32 nKeyLen)

{
  sxu32 sVar1;
  sxi32 sVar2;
  SyHashEntry_Pr *pSStack_30;
  sxu32 nHash;
  SyHashEntry_Pr *pEntry;
  sxu32 nKeyLen_local;
  void *pKey_local;
  SyHash *pHash_local;
  
  sVar1 = (*pHash->xHash)(pKey,nKeyLen);
  pSStack_30 = pHash->apBucket[sVar1 & pHash->nBucketSize - 1];
  while( true ) {
    if (pSStack_30 == (SyHashEntry_Pr *)0x0) {
      return (SyHashEntry_Pr *)0x0;
    }
    if (((pSStack_30->nHash == sVar1) && (pSStack_30->nKeyLen == nKeyLen)) &&
       (sVar2 = (*pHash->xCmp)(pSStack_30->pKey,pKey,nKeyLen), sVar2 == 0)) break;
    pSStack_30 = pSStack_30->pNextCollide;
  }
  return pSStack_30;
}

Assistant:

static SyHashEntry_Pr * HashGetEntry(SyHash *pHash, const void *pKey, sxu32 nKeyLen)
{
	SyHashEntry_Pr *pEntry;
	sxu32 nHash;

	nHash = pHash->xHash(pKey, nKeyLen);
	pEntry = pHash->apBucket[nHash & (pHash->nBucketSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKeyLen == nKeyLen && 
			pHash->xCmp(pEntry->pKey, pKey, nKeyLen) == 0 ){
				return pEntry;
		}
		pEntry = pEntry->pNextCollide;
	}
	/* Entry not found */
	return 0;
}